

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall
Memory::Recycler::CollectWithHeuristic<(Memory::CollectionFlags)2449477633>(Recycler *this)

{
  ulong uVar1;
  uint uVar2;
  DWORD DVar3;
  BOOL BVar4;
  
  if (this->collectionWrapper->_isScriptContextCloseGCPending == 0) {
    uVar1 = (this->autoHeap).uncollectedAllocBytes;
    uVar2 = RecyclerHeuristic::UncollectedAllocBytesCollection();
    if (uVar1 < uVar2) {
      return 0;
    }
    DVar3 = GetTickCount();
    (this->collectionParam).timeDiff = DVar3 - this->tickCountNextCollection;
  }
  BVar4 = Collect<(Memory::CollectionFlags)2449477633>(this);
  return BVar4;
}

Assistant:

BOOL
Recycler::CollectWithHeuristic()
{
    // CollectHeuristic_Never flag should only be used with exhaustive candidate
    Assert((flags & CollectHeuristic_Never) == 0);

    BOOL isScriptContextCloseGCPending = FALSE;
    const BOOL allocSize = flags & CollectHeuristic_AllocSize;
    const BOOL timedIfScriptActive = flags & CollectHeuristic_TimeIfScriptActive;
    const BOOL timedIfInScript = flags & CollectHeuristic_TimeIfInScript;
    const BOOL timed = (timedIfScriptActive && isScriptActive) || (timedIfInScript && isInScript) || (flags & CollectHeuristic_Time);

    if ((flags & CollectOverride_CheckScriptContextClose) != 0)
    {
        isScriptContextCloseGCPending = this->collectionWrapper->GetIsScriptContextCloseGCPending();
    }

    // If there is a script context close GC pending, we need to do a GC regardless
    // Otherwise, we should check the heuristics to see if a GC is necessary
    if (!isScriptContextCloseGCPending)
    {
#if ENABLE_PARTIAL_GC
        if (GetPartialFlag<flags>())
        {
            Assert(enablePartialCollect);
            Assert(allocSize);
            Assert(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount
                && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

            // PARTIAL-GC-REVIEW: For now, we have only alloc size heuristic
            // Maybe improve this heuristic by looking at how many free pages are in the page allocator.
            if (autoHeap.uncollectedNewPageCount > this->uncollectedNewPageCountPartialCollect)
            {
#ifdef ENABLE_JS_ETW
                if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason))
                {
                    collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_Partial_GC_AllocSize_Heuristic;
                }
#endif
                return Collect<flags>();
            }
        }
#endif

        // allocation byte count heuristic, collect every 1 MB allocated
        if (allocSize && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::UncollectedAllocBytesCollection()))
        {
            return FinishDisposeObjectsWrapped<flags>();
        }

        // time heuristic, allocate every 1000 clock tick, or 64 MB is allocated in a short time
        if (timed && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::Instance.MaxUncollectedAllocBytes))
        {
            uint currentTickCount = GetTickCount();
#ifdef RECYCLER_TRACE
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
#endif
            if ((int)(tickCountNextCollection - currentTickCount) >= 0)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
#ifdef RECYCLER_TRACE
        else
        {
            uint currentTickCount = GetTickCount();
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
        }
#endif
    }

    // Passed all the heuristic, do some GC work, maybe
    return Collect<(CollectionFlags)(flags & ~CollectMode_Partial)>();
}